

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O1

bool __thiscall cmValue::IsNOTFOUND(cmValue *this,string_view value)

{
  int iVar1;
  size_type __rlen;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  if ((this == (cmValue *)0x8) && (iVar1 = bcmp((char *)value._M_len,"NOTFOUND",8), iVar1 == 0)) {
    return true;
  }
  if (this < (cmValue *)0x9) {
    bVar2 = false;
  }
  else {
    __str._M_str = "-NOTFOUND";
    __str._M_len = 9;
    local_20._M_len = (size_t)this;
    local_20._M_str = (char *)value._M_len;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_20,(size_type)((long)&this[-2].Value + 7),9,__str);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool cmValue::IsNOTFOUND(cm::string_view value) noexcept
{
  return (value == "NOTFOUND"_s) || cmHasSuffix(value, "-NOTFOUND"_s);
}